

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O1

void __thiscall OpenMD::StatWriter::writeVector(StatWriter *this,int i)

{
  ostream *poVar1;
  Vector3d s;
  Vector3d local_50;
  string local_38;
  
  Stats::getVectorData(&local_50,this->stats_,i);
  if ((((ulong)ABS(local_50.super_Vector<double,_3U>.data_[0]) < 0x7ff0000000000000) &&
      ((ulong)ABS(local_50.super_Vector<double,_3U>.data_[1]) < 0x7ff0000000000000)) &&
     ((ulong)ABS(local_50.super_Vector<double,_3U>.data_[2]) < 0x7ff0000000000000)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\t",1);
    poVar1 = std::ostream::_M_insert<double>(local_50.super_Vector<double,_3U>.data_[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
    poVar1 = std::ostream::_M_insert<double>(local_50.super_Vector<double,_3U>.data_[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
    std::ostream::_M_insert<double>(local_50.super_Vector<double,_3U>.data_[2]);
  }
  else {
    Stats::getTitle_abi_cxx11_(&local_38,this->stats_,i);
    snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s",
             local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  return;
}

Assistant:

void StatWriter::writeVector(int i) {
    Vector3d s = stats_->getVectorData(i);
    if (std::isinf(s[0]) || std::isnan(s[0]) || std::isinf(s[1]) ||
        std::isnan(s[1]) || std::isinf(s[2]) || std::isnan(s[2])) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StatWriter detected a numerical error writing: %s",
               stats_->getTitle(i).c_str());
      painCave.isFatal = 1;
      simError();
    } else {
      statfile_ << "\t" << s[0] << "\t" << s[1] << "\t" << s[2];
    }
  }